

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3PagerSetPagesize(Pager *pPager,u32 *pPageSize,int nReserve)

{
  sqlite3_io_methods *psVar1;
  int iVar2;
  i64 in_RAX;
  char *p;
  uint nByte_00;
  i64 nByte;
  
  nByte_00 = *pPageSize;
  if ((((pPager->memDb != '\0') && (pPager->dbSize != 0)) ||
      (nByte_00 == 0 || pPager->pPCache->nRefSum != 0)) || (nByte_00 == pPager->pageSize)) {
    nByte_00 = pPager->pageSize;
    nByte = in_RAX;
    goto LAB_0012c401;
  }
  nByte = 0;
  if (pPager->eState == '\0') {
LAB_0012c459:
    p = (char *)pcache1Alloc(nByte_00);
    if (p != (char *)0x0) {
      pager_reset(pPager);
      iVar2 = sqlite3PcacheSetPageSize(pPager->pPCache,nByte_00);
      if (iVar2 == 0) {
        pcache1Free(pPager->pTmpSpace);
        pPager->pTmpSpace = p;
        pPager->dbSize = (Pgno)((long)(nByte + (ulong)nByte_00 + -1) / (long)(ulong)nByte_00);
        pPager->pageSize = nByte_00;
LAB_0012c401:
        *pPageSize = nByte_00;
        if (nReserve < 0) {
          nReserve = (int)(ushort)pPager->nReserve;
        }
        pPager->nReserve = (i16)nReserve;
        pagerFixMaplimit(pPager);
        return 0;
      }
      goto LAB_0012c490;
    }
    iVar2 = 7;
  }
  else {
    psVar1 = pPager->fd->pMethods;
    if ((psVar1 == (sqlite3_io_methods *)0x0) ||
       (iVar2 = (*psVar1->xFileSize)(pPager->fd,&nByte), iVar2 == 0)) goto LAB_0012c459;
  }
  p = (char *)0x0;
LAB_0012c490:
  pcache1Free(p);
  *pPageSize = pPager->pageSize;
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerSetPagesize(Pager *pPager, u32 *pPageSize, int nReserve){
  int rc = SQLITE_OK;

  /* It is not possible to do a full assert_pager_state() here, as this
  ** function may be called from within PagerOpen(), before the state
  ** of the Pager object is internally consistent.
  **
  ** At one point this function returned an error if the pager was in 
  ** PAGER_ERROR state. But since PAGER_ERROR state guarantees that
  ** there is at least one outstanding page reference, this function
  ** is a no-op for that case anyhow.
  */

  u32 pageSize = *pPageSize;
  assert( pageSize==0 || (pageSize>=512 && pageSize<=SQLITE_MAX_PAGE_SIZE) );
  if( (pPager->memDb==0 || pPager->dbSize==0)
   && sqlite3PcacheRefCount(pPager->pPCache)==0 
   && pageSize && pageSize!=(u32)pPager->pageSize 
  ){
    char *pNew = NULL;             /* New temp space */
    i64 nByte = 0;

    if( pPager->eState>PAGER_OPEN && isOpen(pPager->fd) ){
      rc = sqlite3OsFileSize(pPager->fd, &nByte);
    }
    if( rc==SQLITE_OK ){
      pNew = (char *)sqlite3PageMalloc(pageSize);
      if( !pNew ) rc = SQLITE_NOMEM_BKPT;
    }

    if( rc==SQLITE_OK ){
      pager_reset(pPager);
      rc = sqlite3PcacheSetPageSize(pPager->pPCache, pageSize);
    }
    if( rc==SQLITE_OK ){
      sqlite3PageFree(pPager->pTmpSpace);
      pPager->pTmpSpace = pNew;
      pPager->dbSize = (Pgno)((nByte+pageSize-1)/pageSize);
      pPager->pageSize = pageSize;
    }else{
      sqlite3PageFree(pNew);
    }
  }

  *pPageSize = pPager->pageSize;
  if( rc==SQLITE_OK ){
    if( nReserve<0 ) nReserve = pPager->nReserve;
    assert( nReserve>=0 && nReserve<1000 );
    pPager->nReserve = (i16)nReserve;
    pagerReportSize(pPager);
    pagerFixMaplimit(pPager);
  }
  return rc;
}